

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

uint32_t __thiscall wasm::WasmBinaryWriter::getStringIndex(WasmBinaryWriter *this,Name string)

{
  const_iterator cVar1;
  undefined1 local_18 [8];
  Name string_local;
  
  string_local.super_IString.str._M_len = string.super_IString.str._M_str;
  local_18 = string.super_IString.str._M_len;
  cVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->stringIndexes)._M_h,(key_type *)local_18);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)cVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>.
                   _M_cur + 0x18);
  }
  __assert_fail("it != stringIndexes.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x2e9,"uint32_t wasm::WasmBinaryWriter::getStringIndex(Name) const");
}

Assistant:

uint32_t WasmBinaryWriter::getStringIndex(Name string) const {
  auto it = stringIndexes.find(string);
  assert(it != stringIndexes.end());
  return it->second;
}